

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolb.c
# Opt level: O0

int ffgclb(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          long elemincre,int nultyp,uchar nulval,uchar *array,char *nularray,int *anynul,int *status
          )

{
  fitsfile *pfVar1;
  char *in_RCX;
  char *in_RDX;
  uint in_ESI;
  int *in_RDI;
  size_t in_R8;
  FITSfile *in_R9;
  fitsfile *values;
  fitsfile *status_00;
  fitsfile *incre_00;
  int in_stack_00000008;
  uchar in_stack_00000010;
  long in_stack_00000018;
  void *in_stack_00000020;
  fitsfile *in_stack_00000028;
  fitsfile *in_stack_00000030;
  u_tag u;
  void *buffer;
  double cbuff [3600];
  char snull [20];
  char message [81];
  char tform [20];
  LONGLONG maxelem;
  LONGLONG rowincre;
  LONGLONG next;
  LONGLONG remain;
  LONGLONG rownum;
  LONGLONG rowlen;
  LONGLONG tnull;
  LONGLONG readptr;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  int readcheck;
  int nulcheck;
  int convert;
  long xwidth;
  long ii;
  long ntodo;
  long incre;
  long twidth;
  int decimals;
  int xcode;
  int hdutype;
  int maxelem2;
  int tcode;
  double dtemp;
  double power;
  double zero;
  double scale;
  fitsfile *nvals;
  fitsfile *fptr_00;
  fitsfile *fptr_01;
  long *ntodo_00;
  long *input;
  long *anynull;
  long *output;
  int *status_01;
  fitsfile *fptr_02;
  char *gsize;
  fitsfile *fptr_03;
  size_t local_7290;
  fitsfile *pfVar2;
  fitsfile *snull_00;
  fitsfile *pfVar3;
  fitsfile *implipower;
  undefined7 in_stack_ffffffffffff8da8;
  undefined1 in_stack_ffffffffffff8daf;
  double *input_00;
  fitsfile *in_stack_ffffffffffff8db8;
  int *in_stack_ffffffffffff8dc0;
  char *in_stack_ffffffffffff8dc8;
  double *in_stack_ffffffffffff8dd0;
  double *in_stack_ffffffffffff8dd8;
  char *in_stack_ffffffffffff8de0;
  long *in_stack_ffffffffffff8de8;
  int *in_stack_ffffffffffff8df0;
  int *in_stack_ffffffffffff8df8;
  LONGLONG *in_stack_ffffffffffff8e00;
  LONGLONG *in_stack_ffffffffffff8e08;
  long *in_stack_ffffffffffff8e10;
  LONGLONG *in_stack_ffffffffffff8e18;
  LONGLONG *in_stack_ffffffffffff8e20;
  int *in_stack_ffffffffffff8e28;
  LONGLONG *in_stack_ffffffffffff8e30;
  char *in_stack_ffffffffffff8e38;
  int *in_stack_ffffffffffff8e40;
  char local_1c8 [32];
  char local_1a8 [96];
  fitsfile local_148;
  size_t local_130;
  long local_128;
  long local_120;
  size_t local_118;
  long local_110;
  long local_108;
  fitsfile local_100;
  long local_f0;
  long local_e8;
  long local_e0;
  int local_d4;
  int local_d0;
  int in_stack_ffffffffffffff34;
  int iVar4;
  LONGLONG in_stack_ffffffffffffff38;
  LONGLONG in_stack_ffffffffffffff40;
  long lVar5;
  LONGLONG in_stack_ffffffffffffff48;
  long in_stack_ffffffffffffff50;
  fitsfile *in_stack_ffffffffffffff58;
  int local_9c;
  int local_94;
  undefined1 local_90 [8];
  FITSfile *local_88;
  double local_80;
  double local_78;
  FITSfile *local_70;
  FITSfile *local_68;
  undefined4 in_stack_ffffffffffffffb8;
  int local_34;
  
  local_80 = 1.0;
  local_d4 = 0x10;
  if ((in_stack_00000030->HDUposition < 1) && (in_R8 != 0)) {
    input_00 = (double *)&stack0xffffffffffff8db8;
    if (in_stack_00000028 != (fitsfile *)0x0) {
      in_stack_00000028->HDUposition = 0;
    }
    local_68 = in_R9;
    if (in_stack_00000008 == 2) {
      memset(in_stack_00000020,0,in_R8);
    }
    if ((long)local_68 < 0) {
      local_d4 = local_d4 + -1;
    }
    incre_00 = &local_148;
    gsize = local_1c8;
    status_00 = (fitsfile *)&local_70;
    values = (fitsfile *)&local_78;
    nvals = (fitsfile *)&stack0xffffffffffffff58;
    fptr_00 = (fitsfile *)(local_90 + 4);
    fptr_01 = (fitsfile *)local_90;
    ntodo_00 = &local_e8;
    input = &local_f0;
    anynull = &local_e0;
    output = &local_108;
    status_01 = &local_94;
    fptr_02 = &local_100;
    fptr_03 = in_stack_00000030;
    pfVar2 = nvals;
    snull_00 = fptr_00;
    pfVar3 = fptr_01;
    implipower = in_stack_00000030;
    ffgcprll(in_stack_ffffffffffff8db8,(int)((ulong)input_00 >> 0x20),
             CONCAT17(in_stack_ffffffffffff8daf,in_stack_ffffffffffff8da8),
             (LONGLONG)in_stack_00000030,(LONGLONG)fptr_01,(int)((ulong)fptr_00 >> 0x20),
             in_stack_ffffffffffff8dd0,in_stack_ffffffffffff8dd8,in_stack_ffffffffffff8de0,
             in_stack_ffffffffffff8de8,in_stack_ffffffffffff8df0,in_stack_ffffffffffff8df8,
             in_stack_ffffffffffff8e00,in_stack_ffffffffffff8e08,in_stack_ffffffffffff8e10,
             in_stack_ffffffffffff8e18,in_stack_ffffffffffff8e20,in_stack_ffffffffffff8e28,
             in_stack_ffffffffffff8e30,in_stack_ffffffffffff8e38,in_stack_ffffffffffff8e40);
    local_130 = (size_t)(int)local_90._0_4_;
    if ((local_90._4_4_ == 0xe) && (local_68 == (FITSfile *)0x1)) {
      ffgcll(in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff34,(char)in_R8,in_RCX,in_RDX,
             (int *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),in_RDI);
      local_34 = in_stack_00000030->HDUposition;
    }
    else if (in_stack_00000030->HDUposition < 1) {
      pfVar1 = (fitsfile *)((long)local_68 * in_stack_ffffffffffffff50);
      local_118 = in_R8;
      if ((local_90._4_4_ == 0x10) && (local_94 == 1)) {
        ffasfm(in_stack_ffffffffffff8dc8,in_stack_ffffffffffff8dc0,(long *)in_stack_ffffffffffff8db8
               ,(int *)input_00,(int *)CONCAT17(in_stack_ffffffffffff8daf,in_stack_ffffffffffff8da8)
              );
        for (lVar5 = 0; local_118 = in_R8, lVar5 < local_9c; lVar5 = lVar5 + 1) {
          local_80 = local_80 * 10.0;
        }
      }
      local_d0 = in_stack_00000008;
      if ((in_stack_00000008 == 1) && (in_stack_00000010 == '\0')) {
        local_d0 = 0;
      }
      else if (((int)local_90._4_4_ % 10 == 1) && (local_100._0_8_ == 0x4995cdd1)) {
        local_d0 = 0;
      }
      else if ((local_90._4_4_ == 0x15) &&
              ((0x7fff < (long)local_100._0_8_ || ((long)local_100._0_8_ < -0x8000)))) {
        local_d0 = 0;
      }
      else if ((local_90._4_4_ == 0xb) &&
              ((0xff < (long)local_100._0_8_ || ((long)local_100._0_8_ < 0)))) {
        local_d0 = 0;
      }
      else if ((local_90._4_4_ == 0x10) && (local_1c8[0] == '\x01')) {
        local_d0 = 0;
      }
      iVar4 = 1;
      if (local_90._4_4_ == 0xb) {
        local_130 = local_118;
        if (0x7ffffffe < (long)local_118) {
          local_130 = 0x7fffffff;
        }
        if ((((local_d0 == 0) && ((double)local_70 == 1.0)) && (!NAN((double)local_70))) &&
           ((local_78 == 0.0 && (!NAN(local_78))))) {
          iVar4 = 0;
        }
      }
      local_120 = 0;
      local_110 = 0;
      while (local_118 != 0) {
        if ((long)local_118 < (long)local_130) {
          local_7290 = local_118;
        }
        else {
          local_7290 = local_130;
        }
        if ((long)local_68 < 0) {
          if (local_f0 / -(long)local_68 + 1 <= (long)local_7290) {
            local_7290 = local_f0 / -(long)local_68 + 1;
          }
        }
        else if (((local_e0 - local_f0) + -1) / (long)local_68 + 1 <= (long)local_7290) {
          local_7290 = ((local_e0 - local_f0) + -1) / (long)local_68 + 1;
        }
        local_100.Fptr =
             (FITSfile *)
             (local_e8 + local_110 * local_108 + local_f0 * ((long)pfVar1 / (long)local_68));
        if (local_90._4_4_ == 0xb) {
          ffgi1b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(uchar *)values,
                 &status_00->HDUposition);
          if (iVar4 != 0) {
            values = (fitsfile *)(in_stack_00000018 + local_120);
            status_00 = in_stack_00000028;
            incre_00 = in_stack_00000030;
            fffi1i1((uchar *)input,(long)ntodo_00,(double)fptr_01,(double)fptr_00,
                    (int)((ulong)nvals >> 0x20),(uchar)((ulong)nvals >> 0x18),
                    (uchar)((ulong)nvals >> 0x10),(char *)in_stack_00000030,(int *)anynull,
                    (uchar *)output,status_01);
          }
        }
        else if (local_90._4_4_ == 0x10) {
          ffmbyt(fptr_00,(LONGLONG)nvals,(int)((ulong)incre_00 >> 0x20),&values->HDUposition);
          if (pfVar1 == in_stack_ffffffffffffff58) {
            ffgbyt(fptr_02,(LONGLONG)status_01,output,(int *)anynull);
          }
          else {
            ffgbytoff(fptr_03,(long)gsize,(long)fptr_02,(long)status_01,output,(int *)anynull);
          }
          status_00 = (fitsfile *)((long)in_stack_00000020 + local_120);
          incre_00 = (fitsfile *)(in_stack_00000018 + local_120);
          values = in_stack_00000028;
          nvals = in_stack_00000030;
          fffstri1(in_stack_ffffffffffff8dc8,(long)in_stack_ffffffffffff8dc0,
                   (double)in_stack_ffffffffffff8db8,(double)input_00,
                   CONCAT17(in_stack_ffffffffffff8daf,in_stack_ffffffffffff8da8),(double)implipower,
                   (int)((ulong)pfVar3 >> 0x20),(char *)snull_00,(uchar)((ulong)pfVar2 >> 0x38),
                   in_stack_ffffffffffff8de0,(int *)in_stack_ffffffffffff8de8,
                   (uchar *)in_stack_ffffffffffff8df0,in_stack_ffffffffffff8df8);
        }
        else if (local_90._4_4_ == 0x15) {
          ffgi2b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(short *)values,
                 &status_00->HDUposition);
          values = (fitsfile *)(in_stack_00000018 + local_120);
          status_00 = in_stack_00000028;
          incre_00 = in_stack_00000030;
          fffi2i1((short *)input_00,local_7290,(double)local_70,local_78,local_d0,
                  (short)local_100.HDUposition,in_stack_00000010,
                  (char *)((long)in_stack_00000020 + local_120),&in_stack_00000028->HDUposition,
                  (uchar *)values,&in_stack_00000030->HDUposition);
        }
        else if (local_90._4_4_ == 0x29) {
          ffgi4b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,&values->HDUposition,
                 &status_00->HDUposition);
          values = (fitsfile *)(in_stack_00000018 + local_120);
          status_00 = in_stack_00000028;
          incre_00 = in_stack_00000030;
          fffi4i1((int *)input_00,local_7290,(double)local_70,local_78,local_d0,
                  local_100.HDUposition,in_stack_00000010,
                  (char *)((long)in_stack_00000020 + local_120),&in_stack_00000028->HDUposition,
                  (uchar *)values,&in_stack_00000030->HDUposition);
        }
        else if (local_90._4_4_ == 0x2a) {
          ffgr4b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(float *)values,
                 &status_00->HDUposition);
          status_00 = (fitsfile *)(in_stack_00000018 + local_120);
          values = in_stack_00000030;
          fffr4i1((float *)input_00,local_7290,(double)local_70,local_78,local_d0,in_stack_00000010,
                  (char *)((long)in_stack_00000020 + local_120),&in_stack_00000028->HDUposition,
                  (uchar *)status_00,&in_stack_00000030->HDUposition);
        }
        else if (local_90._4_4_ == 0x51) {
          ffgi8b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(long *)values,
                 &status_00->HDUposition);
          values = (fitsfile *)(in_stack_00000018 + local_120);
          status_00 = in_stack_00000028;
          incre_00 = in_stack_00000030;
          fffi8i1((LONGLONG *)input_00,local_7290,(double)local_70,local_78,local_d0,local_100._0_8_
                  ,in_stack_00000010,(char *)((long)in_stack_00000020 + local_120),
                  &in_stack_00000028->HDUposition,(uchar *)values,&in_stack_00000030->HDUposition);
        }
        else {
          if (local_90._4_4_ != 0x52) {
            snprintf(local_1a8,0x51,"Cannot read bytes from column %d which has format %s",
                     (ulong)in_ESI,&local_148);
            ffpmsg((char *)0x17d20c);
            if (local_94 == 1) {
              in_stack_00000030->HDUposition = 0x137;
              return 0x137;
            }
            in_stack_00000030->HDUposition = 0x138;
            return 0x138;
          }
          ffgr8b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(double *)values,
                 &status_00->HDUposition);
          status_00 = (fitsfile *)(in_stack_00000018 + local_120);
          values = in_stack_00000030;
          fffr8i1(input_00,local_7290,(double)local_70,local_78,local_d0,in_stack_00000010,
                  (char *)((long)in_stack_00000020 + local_120),&in_stack_00000028->HDUposition,
                  (uchar *)status_00,&in_stack_00000030->HDUposition);
        }
        if (0 < in_stack_00000030->HDUposition) {
          local_88 = (FITSfile *)(double)local_120;
          if (local_94 < 1) {
            snprintf(local_1a8,0x51,"Error reading elements %.0f thru %.0f from image (ffgclb).",
                     (double)local_88 + 1.0,(double)local_88 + (double)(long)local_7290);
          }
          else {
            snprintf(local_1a8,0x51,"Error reading elements %.0f thru %.0f from column %d (ffgclb)."
                     ,(double)local_88 + 1.0,(double)local_88 + (double)(long)local_7290,
                     (ulong)in_ESI);
          }
          ffpmsg((char *)0x17d31c);
          return in_stack_00000030->HDUposition;
        }
        local_118 = local_118 - local_7290;
        if (local_118 != 0) {
          local_120 = local_7290 + local_120;
          local_f0 = local_f0 + local_7290 * (long)local_68;
          if (local_f0 < local_e0) {
            if (local_f0 < 0) {
              local_128 = (-1 - local_f0) / local_e0 + 1;
              local_110 = local_110 - local_128;
              local_f0 = local_128 * local_e0 + local_f0;
            }
          }
          else {
            local_128 = local_f0 / local_e0;
            local_110 = local_128 + local_110;
            local_f0 = local_f0 - local_128 * local_e0;
          }
        }
      }
      if (in_stack_00000030->HDUposition == -0xb) {
        ffpmsg((char *)0x17d48f);
        in_stack_00000030->HDUposition = 0x19c;
      }
      local_34 = in_stack_00000030->HDUposition;
    }
    else {
      local_34 = in_stack_00000030->HDUposition;
    }
  }
  else {
    local_34 = in_stack_00000030->HDUposition;
  }
  return local_34;
}

Assistant:

int ffgclb( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
            LONGLONG firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            long  elemincre,  /* I - pixel increment; e.g., 2 = every other  */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
            unsigned char nulval, /* I - value for null pixels if nultyp = 1 */
            unsigned char *array, /* O - array of values that are read       */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from a column in the current FITS HDU.
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer be a virtual column in a 1 or more grouped FITS primary
  array or image extension.  FITSIO treats a primary array as a binary table
  with 2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.

  The output array of values will be converted from the datatype of the column 
  and will be scaled by the FITS TSCALn and TZEROn values if necessary.
*/
{
    double scale, zero, power = 1., dtemp;
    int tcode, maxelem2, hdutype, xcode, decimals;
    long twidth, incre, ntodo;
    long ii, xwidth;
    int convert, nulcheck, readcheck = 16; /* see note below on readcheck */
    LONGLONG repeat, startpos, elemnum, readptr, tnull;
    LONGLONG rowlen, rownum, remain, next, rowincre, maxelem;
    char tform[20];
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value if reading from ASCII table  */

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    void *buffer;

    union u_tag {
       char charval;
       unsigned char ucharval;
    } u;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    buffer = cbuff;

    if (anynul)
        *anynul = 0;

    if (nultyp == 2)      
       memset(nularray, 0, (size_t) nelem);   /* initialize nullarray */

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (elemincre < 0)
        readcheck -= 1;  /* don't do range checking in this case */

    /* IMPORTANT NOTE: that the special case of using this subroutine
       to read bytes from a character column are handled internally
       by the call to ffgcprll() below.  It will adjust the effective
       *tcode, repeats, etc, to appear as a TBYTE column. */

    /* Note that readcheck = 16 is equivalent to readcheck = 0 
       and readcheck = 15 is equivalent to readcheck = -1, 
       but either of those settings allow TSTRINGS to be 
       treated as TBYTE vectors, but with full error checking */

    ffgcprll( fptr, colnum, firstrow, firstelem, nelem, readcheck, &scale, &zero,
         tform, &twidth, &tcode, &maxelem2, &startpos, &elemnum, &incre,
         &repeat, &rowlen, &hdutype, &tnull, snull, status);
    maxelem = maxelem2;

    /* special case */
    if (tcode == TLOGICAL && elemincre == 1)
    {
        u.ucharval = nulval;
        ffgcll(fptr, colnum, firstrow, firstelem, nelem, nultyp,
               u.charval, (char *) array, nularray, anynul, status);

        return(*status);
    }

    if (*status > 0)
        return(*status);
        
    incre *= elemincre;   /* multiply incre to just get every nth pixel */

    if (tcode == TSTRING && hdutype == ASCII_TBL) /* setup for ASCII tables */
    {
      /* get the number of implied decimal places if no explicit decmal point */
      ffasfm(tform, &xcode, &xwidth, &decimals, status); 
      for(ii = 0; ii < decimals; ii++)
        power *= 10.;
    }
    /*------------------------------------------------------------------*/
    /*  Decide whether to check for null values in the input FITS file: */
    /*------------------------------------------------------------------*/
    nulcheck = nultyp; /* by default, check for null values in the FITS file */

    if (nultyp == 1 && nulval == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    else if (tcode%10 == 1 &&        /* if reading an integer column, and  */ 
            tnull == NULL_UNDEFINED) /* if a null value is not defined,    */
            nulcheck = 0;            /* then do not check for null values. */

    else if (tcode == TSHORT && (tnull > SHRT_MAX || tnull < SHRT_MIN) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TBYTE && (tnull > 255 || tnull < 0) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TSTRING && snull[0] == ASCII_NULL_UNDEFINED)
         nulcheck = 0;

    /*----------------------------------------------------------------------*/
    /*  If FITS column and output data array have same datatype, then we do */
    /*  not need to use a temporary buffer to store intermediate datatype.  */
    /*----------------------------------------------------------------------*/
    convert = 1;
    if (tcode == TBYTE) /* Special Case:                        */
    {                             /* no type convertion required, so read */
                                  /* data directly into output buffer.    */

        if (nelem < (LONGLONG)INT32_MAX) {
            maxelem = nelem;
        } else {
            maxelem = INT32_MAX;
        }

        if (nulcheck == 0 && scale == 1. && zero == 0.)
            convert = 0;  /* no need to scale data or find nulls */
    }

    /*---------------------------------------------------------------------*/
    /*  Now read the pixels from the FITS column. If the column does not   */
    /*  have the same datatype as the output array, then we have to read   */
    /*  the raw values into a temporary buffer (of limited size).  In      */
    /*  the case of a vector colum read only 1 vector of values at a time  */
    /*  then skip to the next row if more values need to be read.          */
    /*  After reading the raw values, then call the fffXXYY routine to (1) */
    /*  test for undefined values, (2) convert the datatype if necessary,  */
    /*  and (3) scale the values by the FITS TSCALn and TZEROn linear      */
    /*  scaling parameters.                                                */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to read */
    next = 0;                 /* next element in array to be read   */
    rownum = 0;               /* row number, relative to firstrow   */

    while (remain)
    {
        /* limit the number of pixels to read at one time to the number that
           will fit in the buffer or to the number of pixels that remain in
           the current vector, which ever is smaller.
        */
        ntodo = (long) minvalue(remain, maxelem);
        if (elemincre >= 0)
        {
          ntodo = (long) minvalue(ntodo, ((repeat - elemnum - 1)/elemincre +1));
        }
        else
        {
          ntodo = (long) minvalue(ntodo, (elemnum/(-elemincre) +1));
        }

        readptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * (incre / elemincre));

        switch (tcode) 
        {
            case (TBYTE):
                ffgi1b(fptr, readptr, ntodo, incre, &array[next], status);
                if (convert)
                    fffi1i1(&array[next], ntodo, scale, zero, nulcheck, 
                    (unsigned char) tnull, nulval, &nularray[next], anynul, 
                           &array[next], status);
                break;
            case (TSHORT):
                ffgi2b(fptr, readptr, ntodo, incre, (short *) buffer, status);
                fffi2i1((short  *) buffer, ntodo, scale, zero, nulcheck, 
                       (short) tnull, nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TLONG):
                ffgi4b(fptr, readptr, ntodo, incre, (INT32BIT *) buffer,
                       status);
                fffi4i1((INT32BIT *) buffer, ntodo, scale, zero, nulcheck, 
                       (INT32BIT) tnull, nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TLONGLONG):
                ffgi8b(fptr, readptr, ntodo, incre, (long *) buffer, status);
                fffi8i1( (LONGLONG *) buffer, ntodo, scale, zero, 
                           nulcheck, tnull, nulval, &nularray[next], 
                            anynul, &array[next], status);
                break;
            case (TFLOAT):
                ffgr4b(fptr, readptr, ntodo, incre, (float  *) buffer, status);
                fffr4i1((float  *) buffer, ntodo, scale, zero, nulcheck, 
                       nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TDOUBLE):
                ffgr8b(fptr, readptr, ntodo, incre, (double *) buffer, status);
                fffr8i1((double *) buffer, ntodo, scale, zero, nulcheck, 
                          nulval, &nularray[next], anynul, 
                          &array[next], status);
                break;
            case (TSTRING):
                ffmbyt(fptr, readptr, REPORT_EOF, status);
       
                if (incre == twidth)    /* contiguous bytes */
                     ffgbyt(fptr, ntodo * twidth, buffer, status);
                else
                     ffgbytoff(fptr, twidth, ntodo, incre - twidth, buffer,
                               status);

                /* interpret the string as an ASCII formated number */
                fffstri1((char *) buffer, ntodo, scale, zero, twidth, power,
                      nulcheck, snull, nulval, &nularray[next], anynul,
                      &array[next], status);
                break;

            default:  /*  error trap for invalid column format */
                snprintf(message, FLEN_ERRMSG,
                   "Cannot read bytes from column %d which has format %s",
                    colnum, tform);
                ffpmsg(message);
                if (hdutype == ASCII_TBL)
                    return(*status = BAD_ATABLE_FORMAT);
                else
                    return(*status = BAD_BTABLE_FORMAT);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous read operation */
        {
	  dtemp = (double) next;
          if (hdutype > 0)
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from column %d (ffgclb).",
              dtemp+1., dtemp+ntodo, colnum);
          else
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from image (ffgclb).",
              dtemp+1., dtemp+ntodo);

         ffpmsg(message);
         return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum = elemnum + (ntodo * elemincre);

            if (elemnum >= repeat)  /* completed a row; start on later row */
            {
                rowincre = elemnum / repeat;
                rownum += rowincre;
                elemnum = elemnum - (rowincre * repeat);
            }
            else if (elemnum < 0)  /* completed a row; start on a previous row */
            {
                rowincre = (-elemnum - 1) / repeat + 1;
                rownum -= rowincre;
                elemnum = (rowincre * repeat) + elemnum;
            }
        }
    }  /*  End of main while Loop  */


    /*--------------------------------*/
    /*  check for numerical overflow  */
    /*--------------------------------*/
    if (*status == OVERFLOW_ERR)
    {
        ffpmsg(
        "Numerical overflow during type conversion while reading FITS data.");
        *status = NUM_OVERFLOW;
    }

    return(*status);
}